

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::log_and_abort(int stack_trace_skip,char *expr,char *file,uint line,char *format,...)

{
  char *buff_00;
  loguru local_50 [8];
  Text buff;
  va_list vlist;
  char *format_local;
  uint line_local;
  char *file_local;
  char *expr_local;
  int stack_trace_skip_local;
  
  buff._str._4_4_ = 0x30;
  buff._str._0_4_ = 0x28;
  vtextprintf(local_50,format,(__va_list_tag *)&buff);
  buff_00 = Text::c_str((Text *)local_50);
  log_to_everywhere(stack_trace_skip + 1,-3,file,line,expr,buff_00);
  abort();
}

Assistant:

void log_and_abort(int stack_trace_skip, const char* expr, const char* file, unsigned line, const char* format, ...)
	{
		va_list vlist;
		va_start(vlist, format);
		auto buff = vtextprintf(format, vlist);
		log_to_everywhere(stack_trace_skip + 1, Verbosity_FATAL, file, line, expr, buff.c_str());
		va_end(vlist);
		abort(); // log_to_everywhere already does this, but this makes the analyzer happy.
	}